

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::ImmutableMapFieldGenerator
          (ImmutableMapFieldGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          int builderBitIndex,Context *context)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  _Rb_tree_header *p_Var1;
  FieldDescriptor *pFVar2;
  FieldDescriptor *pFVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char cVar5;
  undefined8 uVar6;
  pointer pcVar7;
  long lVar8;
  undefined8 uVar9;
  long lVar10;
  bool bVar11;
  JavaType type;
  JavaType type_00;
  ClassNameResolver *pCVar12;
  FieldGeneratorInfo *info;
  Descriptor *pDVar13;
  mapped_type *pmVar14;
  LogMessage *pLVar15;
  FieldDescriptor *pFVar16;
  undefined8 *puVar17;
  long *plVar18;
  char *pcVar19;
  long *plVar20;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar21;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *pFVar22;
  Descriptor *descriptor_00;
  ulong uVar23;
  Context *name_resolver;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type __dnew_1;
  size_type __dnew;
  string boxed_key_type;
  size_type __dnew_8;
  size_type __dnew_3;
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  FieldDescriptor *local_110;
  FieldDescriptor *local_108;
  key_type local_100;
  uint local_dc;
  FieldDescriptor *local_d8;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0 [2];
  key_type local_98;
  key_type local_78;
  ImmutableMapFieldGenerator *local_58;
  key_type local_50;
  
  (this->super_ImmutableFieldGenerator)._vptr_ImmutableFieldGenerator =
       (_func_int **)&PTR__ImmutableMapFieldGenerator_0046b738;
  this->descriptor_ = descriptor;
  variables = &this->variables_;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name_resolver = context;
  local_108 = descriptor;
  local_dc = builderBitIndex;
  local_58 = this;
  pCVar12 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar12;
  info = Context::GetFieldGeneratorInfo(context,local_108);
  SetCommonFieldVariables(local_108,info,variables);
  local_110 = (FieldDescriptor *)Context::GetNameResolver(context);
  pDVar13 = FieldDescriptor::message_type(local_108);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_d0,(ClassNameResolver *)local_110,pDVar13,true);
  pFVar2 = (FieldDescriptor *)(local_150 + 0x10);
  local_140._M_allocated_capacity._0_2_ = 0x7974;
  local_140._M_local_buf[2] = 'p';
  local_140._M_local_buf[3] = 'e';
  local_150._8_8_ = 4;
  local_140._M_local_buf[4] = '\0';
  local_150._0_8_ = pFVar2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_150);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_d0);
  pFVar16 = local_108;
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  if (*(once_flag **)(pFVar16 + 0x30) != (once_flag *)0x0) {
    local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_150._0_8_ = pFVar16;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar16 + 0x30),(_func_void_FieldDescriptor_ptr **)local_d0,
               (FieldDescriptor **)local_150);
    pFVar16 = local_108;
  }
  if (*(int *)(pFVar16 + 0x38) != 0xb) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_d0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_map_field.cc"
               ,0x2f);
    pLVar15 = internal::LogMessage::operator<<
                        ((LogMessage *)local_d0,
                         "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (descriptor->type()): ");
    internal::LogFinisher::operator=((LogFinisher *)local_150,pLVar15);
    pFVar16 = local_108;
    internal::LogMessage::~LogMessage((LogMessage *)local_d0);
  }
  pDVar13 = FieldDescriptor::message_type(pFVar16);
  if (*(char *)(*(long *)(pDVar13 + 0x20) + 0x4b) == '\0') {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_d0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_map_field.cc"
               ,0x31);
    pLVar15 = internal::LogMessage::operator<<
                        ((LogMessage *)local_d0,"CHECK failed: message->options().map_entry(): ");
    internal::LogFinisher::operator=((LogFinisher *)local_150,pLVar15);
    internal::LogMessage::~LogMessage((LogMessage *)local_d0);
  }
  local_c0[0]._M_allocated_capacity._0_4_ = 0x79656b;
  local_d0._8_8_ = (char *)0x3;
  local_d0._0_8_ = local_d0 + 0x10;
  pFVar16 = Descriptor::FindFieldByName(pDVar13,(string *)local_d0);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  local_d8 = anon_unknown_1::ValueField(local_108);
  type = GetJavaType(pFVar16);
  type_00 = GetJavaType(local_d8);
  (anonymous_namespace)::TypeName_abi_cxx11_
            ((string *)local_d0,(_anonymous_namespace_ *)pFVar16,local_110,(ClassNameResolver *)0x0,
             SUB81(name_resolver,0));
  local_140._M_allocated_capacity._0_2_ = 0x656b;
  local_140._M_local_buf[2] = 'y';
  local_140._M_local_buf[3] = '_';
  local_140._M_local_buf[4] = 't';
  local_140._M_local_buf[5] = 'y';
  local_140._M_local_buf[6] = 'p';
  local_140._M_local_buf[7] = 'e';
  local_150._8_8_ = 8;
  local_140._M_local_buf[8] = '\0';
  local_150._0_8_ = pFVar2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_150);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_d0);
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  (anonymous_namespace)::TypeName_abi_cxx11_
            ((string *)local_d0,(_anonymous_namespace_ *)pFVar16,local_110,(ClassNameResolver *)0x1,
             SUB81(name_resolver,0));
  local_140._M_allocated_capacity._0_2_ = 0x6f62;
  local_140._M_local_buf[2] = 'x';
  local_140._M_local_buf[3] = 'e';
  local_140._M_local_buf[4] = 'd';
  local_140._M_local_buf[5] = '_';
  local_140._M_local_buf[6] = 'k';
  local_140._M_local_buf[7] = 'e';
  local_140._M_local_buf[8] = 'y';
  local_140._M_local_buf[9] = '_';
  local_140._M_local_buf[10] = 't';
  local_140._M_local_buf[0xb] = 'y';
  local_140._M_local_buf[0xc] = 'p';
  local_140._M_local_buf[0xd] = 'e';
  local_150._8_8_ = 0xe;
  local_140._M_local_buf[0xe] = '\0';
  local_150._0_8_ = pFVar2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_150);
  std::__cxx11::string::_M_assign((string *)pmVar14);
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
  }
  std::__cxx11::string::rfind((char)local_d0,0x2e);
  std::__cxx11::string::substr((ulong)local_150,(ulong)local_d0);
  pFVar3 = (FieldDescriptor *)(local_130 + 0x10);
  local_120._M_allocated_capacity._0_4_ = 0x726f6873;
  local_120._M_local_buf[4] = 't';
  local_120._M_local_buf[5] = '_';
  local_120._M_local_buf[6] = 'k';
  local_120._M_local_buf[7] = 'e';
  local_120._8_2_ = 0x5f79;
  local_120._M_local_buf[10] = 't';
  local_120._11_2_ = 0x7079;
  local_120._M_local_buf[0xd] = 'e';
  local_130._8_8_ = 0xe;
  local_120._M_local_buf[0xe] = '\0';
  local_130._0_8_ = pFVar3;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_130);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
  pFVar22 = extraout_RDX;
  if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
    operator_delete((void *)local_130._0_8_);
    pFVar22 = extraout_RDX_00;
  }
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
    pFVar22 = extraout_RDX_01;
  }
  (anonymous_namespace)::WireType_abi_cxx11_
            ((string *)local_150,(_anonymous_namespace_ *)pFVar16,pFVar22);
  local_120._M_allocated_capacity._0_4_ = 0x5f79656b;
  local_120._M_local_buf[4] = 'w';
  local_120._M_local_buf[5] = 'i';
  local_120._M_local_buf[6] = 'r';
  local_120._M_local_buf[7] = 'e';
  local_120._8_2_ = 0x745f;
  local_120._M_local_buf[10] = 'y';
  local_120._11_2_ = 0x6570;
  local_130._8_8_ = 0xd;
  local_120._M_local_buf[0xd] = '\0';
  local_130._0_8_ = pFVar3;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_130);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
  if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
    operator_delete((void *)local_130._0_8_);
  }
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
  }
  DefaultValue_abi_cxx11_
            ((string *)local_150,(java *)pFVar16,(FieldDescriptor *)0x1,SUB81(local_110,0),
             (ClassNameResolver *)name_resolver);
  local_100._M_dataplus._M_p = (pointer)0x11;
  local_130._0_8_ = pFVar3;
  local_130._0_8_ = std::__cxx11::string::_M_create((ulong *)local_130,(ulong)&local_100);
  local_120._M_allocated_capacity._0_4_ = SUB84(local_100._M_dataplus._M_p,0);
  local_120._M_local_buf[4] = (char)((ulong)local_100._M_dataplus._M_p >> 0x20);
  local_120._M_local_buf[5] = (char)((ulong)local_100._M_dataplus._M_p >> 0x28);
  local_120._M_local_buf[6] = (char)((ulong)local_100._M_dataplus._M_p >> 0x30);
  local_120._M_local_buf[7] = (char)((ulong)local_100._M_dataplus._M_p >> 0x38);
  *(undefined8 *)local_130._0_8_ = 0x616665645f79656b;
  *(undefined8 *)(local_130._0_8_ + 8) = 0x756c61765f746c75;
  *(FieldDescriptor *)(local_130._0_8_ + 0x10) = (FieldDescriptor)0x65;
  local_130._8_8_ = local_100._M_dataplus._M_p;
  *(FieldDescriptor *)(local_130._0_8_ + (long)local_100._M_dataplus._M_p) = (FieldDescriptor)0x0;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_130);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
  if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
    operator_delete((void *)local_130._0_8_);
  }
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
  }
  bVar11 = IsReferenceType(type);
  local_140._M_allocated_capacity._0_2_ = 0x656b;
  local_140._M_local_buf[2] = 'y';
  local_140._M_local_buf[3] = '_';
  local_140._M_local_buf[4] = 'n';
  local_140._M_local_buf[5] = 'u';
  local_140._M_local_buf[6] = 'l';
  local_140._M_local_buf[7] = 'l';
  local_140._M_local_buf[8] = '_';
  local_140._M_local_buf[9] = 'c';
  local_140._M_local_buf[10] = 'h';
  local_140._M_local_buf[0xb] = 'e';
  local_140._M_local_buf[0xc] = 'c';
  local_140._M_local_buf[0xd] = 'k';
  local_150._8_8_ = 0xe;
  local_140._M_local_buf[0xe] = '\0';
  local_150._0_8_ = pFVar2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_150);
  pcVar19 = "if (key == null) { throw new java.lang.NullPointerException(); }";
  if (!bVar11) {
    pcVar19 = "";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,(ulong)pcVar19);
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
  }
  bVar11 = IsReferenceType(type_00);
  pcVar19 = "if (value == null) { throw new java.lang.NullPointerException(); }";
  if (!bVar11) {
    pcVar19 = "";
  }
  local_130._0_8_ = (pointer)0x10;
  local_150._0_8_ = pFVar2;
  local_150._0_8_ = std::__cxx11::string::_M_create((ulong *)local_150,(ulong)local_130);
  local_140._M_allocated_capacity._0_2_ = (undefined2)local_130._0_8_;
  local_140._M_local_buf[2] = SUB81(local_130._0_8_,2);
  local_140._M_local_buf[3] = SUB81(local_130._0_8_,3);
  local_140._M_local_buf[4] = SUB81(local_130._0_8_,4);
  local_140._M_local_buf[5] = SUB81(local_130._0_8_,5);
  local_140._M_local_buf[6] = SUB81(local_130._0_8_,6);
  local_140._M_local_buf[7] = SUB81(local_130._0_8_,7);
  *(undefined8 *)local_150._0_8_ = 0x756e5f65756c6176;
  *(undefined8 *)(local_150._0_8_ + 8) = 0x6b636568635f6c6c;
  local_150._8_8_ = local_130._0_8_;
  *(FieldDescriptor *)(local_150._0_8_ + local_130._0_8_) = (FieldDescriptor)0x0;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_150);
  pCVar12 = (ClassNameResolver *)0x42;
  if (!bVar11) {
    pCVar12 = (ClassNameResolver *)0x0;
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,(ulong)pcVar19);
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
  }
  pFVar16 = local_d8;
  if (type_00 == JAVATYPE_ENUM) {
    local_140._M_allocated_capacity._0_2_ = 0x6176;
    local_140._M_local_buf[2] = 'l';
    local_140._M_local_buf[3] = 'u';
    local_140._M_local_buf[4] = 'e';
    local_140._M_local_buf[5] = '_';
    local_140._M_local_buf[6] = 't';
    local_140._M_local_buf[7] = 'y';
    local_140._M_local_buf[8] = 'p';
    local_140._M_local_buf[9] = 'e';
    local_150._8_8_ = 10;
    local_140._M_local_buf[10] = '\0';
    local_150._0_8_ = pFVar2;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_150);
    pFVar16 = local_d8;
    std::__cxx11::string::_M_replace((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x39d819);
    if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
      operator_delete((void *)local_150._0_8_);
    }
    local_130._0_8_ = (pointer)0x10;
    local_150._0_8_ = pFVar2;
    local_150._0_8_ = std::__cxx11::string::_M_create((ulong *)local_150,(ulong)local_130);
    local_140._M_allocated_capacity._0_2_ = (undefined2)local_130._0_8_;
    local_140._M_local_buf[2] = SUB81(local_130._0_8_,2);
    local_140._M_local_buf[3] = SUB81(local_130._0_8_,3);
    local_140._M_local_buf[4] = SUB81(local_130._0_8_,4);
    local_140._M_local_buf[5] = SUB81(local_130._0_8_,5);
    local_140._M_local_buf[6] = SUB81(local_130._0_8_,6);
    local_140._M_local_buf[7] = SUB81(local_130._0_8_,7);
    *(undefined8 *)local_150._0_8_ = 0x61765f6465786f62;
    *(undefined8 *)(local_150._0_8_ + 8) = 0x657079745f65756c;
    local_150._8_8_ = local_130._0_8_;
    *(FieldDescriptor *)(local_150._0_8_ + local_130._0_8_) = (FieldDescriptor)0x0;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_150);
    pCVar12 = (ClassNameResolver *)0x11;
    std::__cxx11::string::_M_replace((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x396f62);
    pFVar22 = extraout_RDX_02;
    if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
      operator_delete((void *)local_150._0_8_);
      pFVar22 = extraout_RDX_03;
    }
    (anonymous_namespace)::WireType_abi_cxx11_
              ((string *)local_150,(_anonymous_namespace_ *)pFVar16,pFVar22);
    local_120._M_allocated_capacity._0_4_ = 0x756c6176;
    local_120._M_local_buf[4] = 'e';
    local_120._M_local_buf[5] = '_';
    local_120._M_local_buf[6] = 'w';
    local_120._M_local_buf[7] = 'i';
    local_120._8_2_ = 0x6572;
    local_120._M_local_buf[10] = '_';
    local_120._11_2_ = 0x7974;
    local_120._M_local_buf[0xd] = 'p';
    local_120._M_local_buf[0xe] = 'e';
    local_130._8_8_ = 0xf;
    local_120._M_local_buf[0xf] = '\0';
    local_130._0_8_ = pFVar3;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_130);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
    if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
      operator_delete((void *)local_130._0_8_);
    }
    if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
      operator_delete((void *)local_150._0_8_);
    }
    DefaultValue_abi_cxx11_
              ((string *)local_130,(java *)pFVar16,(FieldDescriptor *)0x1,SUB81(local_110,0),pCVar12
              );
    puVar17 = (undefined8 *)std::__cxx11::string::append(local_130);
    pFVar22 = (FieldDescriptor *)(puVar17 + 2);
    if ((FieldDescriptor *)*puVar17 == pFVar22) {
      uVar6 = *(undefined8 *)pFVar22;
      uVar9 = puVar17[3];
      local_140._M_allocated_capacity._0_2_ = (undefined2)uVar6;
      local_140._M_local_buf[2] = (char)((ulong)uVar6 >> 0x10);
      local_140._M_local_buf[3] = (char)((ulong)uVar6 >> 0x18);
      local_140._M_local_buf[4] = (char)((ulong)uVar6 >> 0x20);
      local_140._M_local_buf[5] = (char)((ulong)uVar6 >> 0x28);
      local_140._M_local_buf[6] = (char)((ulong)uVar6 >> 0x30);
      local_140._M_local_buf[7] = (char)((ulong)uVar6 >> 0x38);
      local_140._M_local_buf[8] = (char)uVar9;
      local_140._M_local_buf[9] = (char)((ulong)uVar9 >> 8);
      local_140._M_local_buf[10] = (char)((ulong)uVar9 >> 0x10);
      local_140._M_local_buf[0xb] = (char)((ulong)uVar9 >> 0x18);
      local_140._M_local_buf[0xc] = (char)((ulong)uVar9 >> 0x20);
      local_140._M_local_buf[0xd] = (char)((ulong)uVar9 >> 0x28);
      local_140._M_local_buf[0xe] = (char)((ulong)uVar9 >> 0x30);
      local_140._M_local_buf[0xf] = (char)((ulong)uVar9 >> 0x38);
      local_150._0_8_ = pFVar2;
    }
    else {
      uVar6 = *(undefined8 *)pFVar22;
      local_140._M_allocated_capacity._0_2_ = (undefined2)uVar6;
      local_140._M_local_buf[2] = (char)((ulong)uVar6 >> 0x10);
      local_140._M_local_buf[3] = (char)((ulong)uVar6 >> 0x18);
      local_140._M_local_buf[4] = (char)((ulong)uVar6 >> 0x20);
      local_140._M_local_buf[5] = (char)((ulong)uVar6 >> 0x28);
      local_140._M_local_buf[6] = (char)((ulong)uVar6 >> 0x30);
      local_140._M_local_buf[7] = (char)((ulong)uVar6 >> 0x38);
      local_150._0_8_ = (FieldDescriptor *)*puVar17;
    }
    local_150._8_8_ = puVar17[1];
    *puVar17 = pFVar22;
    puVar17[1] = 0;
    *(undefined1 *)(puVar17 + 2) = 0;
    paVar4 = &local_100.field_2;
    local_78._M_dataplus._M_p = (pointer)0x13;
    local_100._M_dataplus._M_p = (pointer)paVar4;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_78);
    local_100.field_2._M_allocated_capacity._0_5_ = SUB85(local_78._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[5] = (char)((ulong)local_78._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_allocated_capacity._6_2_ =
         (undefined2)((ulong)local_78._M_dataplus._M_p >> 0x30);
    builtin_strncpy(local_100._M_dataplus._M_p,"value_default_value",0x13);
    local_100._M_string_length = (size_type)local_78._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_78._M_dataplus._M_p] = '\0';
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_100);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar4) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
      operator_delete((void *)local_150._0_8_);
    }
    if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
      operator_delete((void *)local_130._0_8_);
    }
    (anonymous_namespace)::TypeName_abi_cxx11_
              ((string *)local_150,(_anonymous_namespace_ *)pFVar16,local_110,
               (ClassNameResolver *)0x0,SUB81(pCVar12,0));
    local_120._M_allocated_capacity._0_4_ = 0x756c6176;
    local_120._M_local_buf[4] = 'e';
    local_120._M_local_buf[5] = '_';
    local_120._M_local_buf[6] = 'e';
    local_120._M_local_buf[7] = 'n';
    local_120._8_2_ = 0x6d75;
    local_120._M_local_buf[10] = '_';
    local_120._11_2_ = 0x7974;
    local_120._M_local_buf[0xd] = 'p';
    local_120._M_local_buf[0xe] = 'e';
    local_130._8_8_ = 0xf;
    local_120._M_local_buf[0xf] = '\0';
    local_130._0_8_ = pFVar3;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_130);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
    if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
      operator_delete((void *)local_130._0_8_);
    }
    if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
      operator_delete((void *)local_150._0_8_);
    }
    if (*(int *)(*(long *)(local_108 + 0x28) + 0x3c) != 3) {
      DefaultValue_abi_cxx11_
                ((string *)local_150,(java *)local_d8,(FieldDescriptor *)0x1,SUB81(local_110,0),
                 pCVar12);
      local_100._M_dataplus._M_p = (char *)0x12;
      local_130._0_8_ = pFVar3;
      local_130._0_8_ = std::__cxx11::string::_M_create((ulong *)local_130,(ulong)&local_100);
      local_120._M_allocated_capacity._0_4_ = SUB84(local_100._M_dataplus._M_p,0);
      local_120._M_local_buf[4] = (char)((ulong)local_100._M_dataplus._M_p >> 0x20);
      local_120._M_local_buf[5] = (char)((ulong)local_100._M_dataplus._M_p >> 0x28);
      local_120._M_local_buf[6] = (char)((ulong)local_100._M_dataplus._M_p >> 0x30);
      local_120._M_local_buf[7] = (char)((ulong)local_100._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_130._0_8_ = 0x6e676f6365726e75;
      *(undefined8 *)(local_130._0_8_ + 8) = 0x6c61765f64657a69;
      *(undefined2 *)(local_130._0_8_ + 0x10) = 0x6575;
      local_130._8_8_ = local_100._M_dataplus._M_p;
      *(FieldDescriptor *)(local_130._0_8_ + (long)local_100._M_dataplus._M_p) =
           (FieldDescriptor)0x0;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,(key_type *)local_130);
      goto LAB_002d44b3;
    }
    local_120._M_allocated_capacity._0_4_ = 0x756c6176;
    local_120._M_local_buf[4] = 'e';
    local_120._M_local_buf[5] = '_';
    local_120._M_local_buf[6] = 'e';
    local_120._M_local_buf[7] = 'n';
    local_120._8_2_ = 0x6d75;
    local_120._M_local_buf[10] = '_';
    local_120._11_2_ = 0x7974;
    local_120._M_local_buf[0xd] = 'p';
    local_120._M_local_buf[0xe] = 'e';
    local_130._8_8_ = (char *)0xf;
    local_120._M_local_buf[0xf] = '\0';
    local_130._0_8_ = pFVar3;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_130);
    pcVar7 = (pmVar14->_M_dataplus)._M_p;
    local_150._0_8_ = pFVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_150,pcVar7,pcVar7 + pmVar14->_M_string_length);
    std::__cxx11::string::append(local_150);
    local_78._M_dataplus._M_p = (pointer)0x12;
    local_100._M_dataplus._M_p = (pointer)paVar4;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_78);
    local_100.field_2._M_allocated_capacity._0_5_ = SUB85(local_78._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[5] = (char)((ulong)local_78._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_allocated_capacity._6_2_ =
         (undefined2)((ulong)local_78._M_dataplus._M_p >> 0x30);
    builtin_strncpy(local_100._M_dataplus._M_p,"unrecognized_value",0x12);
    local_100._M_string_length = (size_type)local_78._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_78._M_dataplus._M_p] = '\0';
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_100);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar4) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
      operator_delete((void *)local_150._0_8_);
    }
    pFVar16 = (FieldDescriptor *)local_130._0_8_;
    if ((FieldDescriptor *)local_130._0_8_ != pFVar3) goto LAB_002d44d9;
  }
  else {
    (anonymous_namespace)::TypeName_abi_cxx11_
              ((string *)local_150,(_anonymous_namespace_ *)local_d8,local_110,
               (ClassNameResolver *)0x0,SUB81(pCVar12,0));
    local_120._M_allocated_capacity._0_4_ = 0x756c6176;
    local_120._M_local_buf[4] = 'e';
    local_120._M_local_buf[5] = '_';
    local_120._M_local_buf[6] = 't';
    local_120._M_local_buf[7] = 'y';
    local_120._8_2_ = 0x6570;
    local_130._8_8_ = 10;
    local_120._M_local_buf[10] = '\0';
    local_130._0_8_ = pFVar3;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_130);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
    if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
      operator_delete((void *)local_130._0_8_);
    }
    if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
      operator_delete((void *)local_150._0_8_);
    }
    (anonymous_namespace)::TypeName_abi_cxx11_
              ((string *)local_150,(_anonymous_namespace_ *)pFVar16,local_110,
               (ClassNameResolver *)0x1,SUB81(pCVar12,0));
    local_100._M_dataplus._M_p = (pointer)0x10;
    local_130._0_8_ = pFVar3;
    local_130._0_8_ = std::__cxx11::string::_M_create((ulong *)local_130,(ulong)&local_100);
    local_120._M_allocated_capacity._0_4_ = SUB84(local_100._M_dataplus._M_p,0);
    local_120._M_local_buf[4] = (char)((ulong)local_100._M_dataplus._M_p >> 0x20);
    local_120._M_local_buf[5] = (char)((ulong)local_100._M_dataplus._M_p >> 0x28);
    local_120._M_local_buf[6] = (char)((ulong)local_100._M_dataplus._M_p >> 0x30);
    local_120._M_local_buf[7] = (char)((ulong)local_100._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_130._0_8_ = 0x61765f6465786f62;
    *(undefined8 *)(local_130._0_8_ + 8) = 0x657079745f65756c;
    local_130._8_8_ = local_100._M_dataplus._M_p;
    *(FieldDescriptor *)(local_130._0_8_ + (long)local_100._M_dataplus._M_p) = (FieldDescriptor)0x0;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_130);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
    pFVar22 = extraout_RDX_04;
    if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
      operator_delete((void *)local_130._0_8_);
      pFVar22 = extraout_RDX_05;
    }
    if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
      operator_delete((void *)local_150._0_8_);
      pFVar22 = extraout_RDX_06;
    }
    (anonymous_namespace)::WireType_abi_cxx11_
              ((string *)local_150,(_anonymous_namespace_ *)pFVar16,pFVar22);
    local_120._M_allocated_capacity._0_4_ = 0x756c6176;
    local_120._M_local_buf[4] = 'e';
    local_120._M_local_buf[5] = '_';
    local_120._M_local_buf[6] = 'w';
    local_120._M_local_buf[7] = 'i';
    local_120._8_2_ = 0x6572;
    local_120._M_local_buf[10] = '_';
    local_120._11_2_ = 0x7974;
    local_120._M_local_buf[0xd] = 'p';
    local_120._M_local_buf[0xe] = 'e';
    local_130._8_8_ = 0xf;
    local_120._M_local_buf[0xf] = '\0';
    local_130._0_8_ = pFVar3;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_130);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
    if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
      operator_delete((void *)local_130._0_8_);
    }
    if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
      operator_delete((void *)local_150._0_8_);
    }
    DefaultValue_abi_cxx11_
              ((string *)local_150,(java *)pFVar16,(FieldDescriptor *)0x1,SUB81(local_110,0),pCVar12
              );
    local_100._M_dataplus._M_p = (char *)0x13;
    local_130._0_8_ = pFVar3;
    local_130._0_8_ = std::__cxx11::string::_M_create((ulong *)local_130,(ulong)&local_100);
    local_120._M_allocated_capacity._0_4_ = SUB84(local_100._M_dataplus._M_p,0);
    local_120._M_local_buf[4] = (char)((ulong)local_100._M_dataplus._M_p >> 0x20);
    local_120._M_local_buf[5] = (char)((ulong)local_100._M_dataplus._M_p >> 0x28);
    local_120._M_local_buf[6] = (char)((ulong)local_100._M_dataplus._M_p >> 0x30);
    local_120._M_local_buf[7] = (char)((ulong)local_100._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_130._0_8_ = 0x65645f65756c6176;
    *(undefined8 *)(local_130._0_8_ + 8) = 0x61765f746c756166;
    *(undefined4 *)(local_130._0_8_ + 0xf) = 0x65756c61;
    local_130._8_8_ = local_100._M_dataplus._M_p;
    *(FieldDescriptor *)(local_130._0_8_ + (long)local_100._M_dataplus._M_p) = (FieldDescriptor)0x0;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_130);
LAB_002d44b3:
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
    if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
      operator_delete((void *)local_130._0_8_);
    }
    pFVar16 = (FieldDescriptor *)local_150._0_8_;
    if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
LAB_002d44d9:
      operator_delete(pFVar16);
    }
  }
  paVar4 = &local_100.field_2;
  local_100.field_2._M_allocated_capacity._0_5_ = 0x6465786f62;
  local_100.field_2._M_local_buf[5] = '_';
  local_100.field_2._M_allocated_capacity._6_2_ = 0x656b;
  local_100.field_2._8_5_ = 0x7079745f79;
  local_100.field_2._M_local_buf[0xd] = 'e';
  local_100._M_string_length = 0xe;
  local_100.field_2._M_local_buf[0xe] = '\0';
  local_100._M_dataplus._M_p = (pointer)paVar4;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_100);
  pcVar7 = (pmVar14->_M_dataplus)._M_p;
  local_130._0_8_ = pFVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_130,pcVar7,pcVar7 + pmVar14->_M_string_length);
  std::__cxx11::string::append(local_130);
  local_98._M_dataplus._M_p = (pointer)0x10;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_98);
  local_78.field_2._M_allocated_capacity = (size_type)local_98._M_dataplus._M_p;
  builtin_strncpy(local_78._M_dataplus._M_p,"boxed_value_type",0x10);
  local_78._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_78._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_78);
  puVar17 = (undefined8 *)
            std::__cxx11::string::_M_append(local_130,(ulong)(pmVar14->_M_dataplus)._M_p);
  pFVar16 = (FieldDescriptor *)(puVar17 + 2);
  if ((FieldDescriptor *)*puVar17 == pFVar16) {
    uVar6 = *(undefined8 *)pFVar16;
    uVar9 = puVar17[3];
    local_140._M_allocated_capacity._0_2_ = (undefined2)uVar6;
    local_140._M_local_buf[2] = (char)((ulong)uVar6 >> 0x10);
    local_140._M_local_buf[3] = (char)((ulong)uVar6 >> 0x18);
    local_140._M_local_buf[4] = (char)((ulong)uVar6 >> 0x20);
    local_140._M_local_buf[5] = (char)((ulong)uVar6 >> 0x28);
    local_140._M_local_buf[6] = (char)((ulong)uVar6 >> 0x30);
    local_140._M_local_buf[7] = (char)((ulong)uVar6 >> 0x38);
    local_140._M_local_buf[8] = (char)uVar9;
    local_140._M_local_buf[9] = (char)((ulong)uVar9 >> 8);
    local_140._M_local_buf[10] = (char)((ulong)uVar9 >> 0x10);
    local_140._M_local_buf[0xb] = (char)((ulong)uVar9 >> 0x18);
    local_140._M_local_buf[0xc] = (char)((ulong)uVar9 >> 0x20);
    local_140._M_local_buf[0xd] = (char)((ulong)uVar9 >> 0x28);
    local_140._M_local_buf[0xe] = (char)((ulong)uVar9 >> 0x30);
    local_140._M_local_buf[0xf] = (char)((ulong)uVar9 >> 0x38);
    local_150._0_8_ = pFVar2;
  }
  else {
    uVar6 = *(undefined8 *)pFVar16;
    local_140._M_allocated_capacity._0_2_ = (undefined2)uVar6;
    local_140._M_local_buf[2] = (char)((ulong)uVar6 >> 0x10);
    local_140._M_local_buf[3] = (char)((ulong)uVar6 >> 0x18);
    local_140._M_local_buf[4] = (char)((ulong)uVar6 >> 0x20);
    local_140._M_local_buf[5] = (char)((ulong)uVar6 >> 0x28);
    local_140._M_local_buf[6] = (char)((ulong)uVar6 >> 0x30);
    local_140._M_local_buf[7] = (char)((ulong)uVar6 >> 0x38);
    local_150._0_8_ = (FieldDescriptor *)*puVar17;
  }
  local_150._8_8_ = puVar17[1];
  *puVar17 = pFVar16;
  puVar17[1] = 0;
  *(undefined1 *)(puVar17 + 2) = 0;
  local_98.field_2._M_allocated_capacity._0_7_ = 0x61705f65707974;
  local_98.field_2._M_local_buf[7] = 'r';
  local_98.field_2._8_7_ = 0x73726574656d61;
  local_98._M_string_length = 0xf;
  local_98.field_2._M_local_buf[0xf] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_98);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
    operator_delete((void *)local_130._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar4) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  cVar5 = *(char *)(*(long *)(local_108 + 0x78) + 0x4e);
  local_140._M_allocated_capacity._0_2_ = 0x6564;
  local_140._M_local_buf[2] = 'p';
  local_140._M_local_buf[3] = 'r';
  local_140._M_local_buf[4] = 'e';
  local_140._M_local_buf[5] = 'c';
  local_140._M_local_buf[6] = 'a';
  local_140._M_local_buf[7] = 't';
  local_140._M_local_buf[8] = 'i';
  local_140._M_local_buf[9] = 'o';
  local_140._M_local_buf[10] = 'n';
  local_150._8_8_ = 0xb;
  local_140._M_local_buf[0xb] = '\0';
  local_150._0_8_ = pFVar2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_150);
  pcVar19 = "";
  if (cVar5 != '\0') {
    pcVar19 = "@java.lang.Deprecated ";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,(ulong)pcVar19);
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
  }
  local_140._M_allocated_capacity._0_2_ = 0x6e6f;
  local_140._M_local_buf[2] = '_';
  local_140._M_local_buf[3] = 'c';
  local_140._M_local_buf[4] = 'h';
  local_140._M_local_buf[5] = 'a';
  local_140._M_local_buf[6] = 'n';
  local_140._M_local_buf[7] = 'g';
  local_140._M_local_buf[8] = 'e';
  local_140._M_local_buf[9] = 'd';
  local_150._8_8_ = 10;
  local_140._M_local_buf[10] = '\0';
  local_150._0_8_ = pFVar2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_150);
  std::__cxx11::string::_M_replace((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x3c9201);
  iVar21 = extraout_EDX;
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
    iVar21 = extraout_EDX_00;
  }
  GenerateGetBitMutableLocal_abi_cxx11_((string *)local_150,(java *)(ulong)local_dc,iVar21);
  local_100._M_dataplus._M_p = (pointer)0x16;
  local_130._0_8_ = pFVar3;
  local_130._0_8_ = std::__cxx11::string::_M_create((ulong *)local_130,(ulong)&local_100);
  local_120._M_allocated_capacity._0_4_ = SUB84(local_100._M_dataplus._M_p,0);
  local_120._M_local_buf[4] = (char)((ulong)local_100._M_dataplus._M_p >> 0x20);
  local_120._M_local_buf[5] = (char)((ulong)local_100._M_dataplus._M_p >> 0x28);
  local_120._M_local_buf[6] = (char)((ulong)local_100._M_dataplus._M_p >> 0x30);
  local_120._M_local_buf[7] = (char)((ulong)local_100._M_dataplus._M_p >> 0x38);
  *(undefined8 *)local_130._0_8_ = 0x6174756d5f746567;
  *(undefined8 *)(local_130._0_8_ + 8) = 0x5f7469625f656c62;
  *(undefined8 *)(local_130._0_8_ + 0xe) = 0x7265737261705f74;
  local_130._8_8_ = local_100._M_dataplus._M_p;
  *(FieldDescriptor *)(local_130._0_8_ + (long)local_100._M_dataplus._M_p) = (FieldDescriptor)0x0;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_130);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
  iVar21 = extraout_EDX_01;
  if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
    operator_delete((void *)local_130._0_8_);
    iVar21 = extraout_EDX_02;
  }
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
    iVar21 = extraout_EDX_03;
  }
  GenerateSetBitMutableLocal_abi_cxx11_((string *)local_150,(java *)(ulong)local_dc,iVar21);
  local_100._M_dataplus._M_p = (pointer)0x16;
  local_130._0_8_ = pFVar3;
  local_130._0_8_ = std::__cxx11::string::_M_create((ulong *)local_130,(ulong)&local_100);
  local_120._M_allocated_capacity._0_4_ = SUB84(local_100._M_dataplus._M_p,0);
  local_120._M_local_buf[4] = (char)((ulong)local_100._M_dataplus._M_p >> 0x20);
  local_120._M_local_buf[5] = (char)((ulong)local_100._M_dataplus._M_p >> 0x28);
  local_120._M_local_buf[6] = (char)((ulong)local_100._M_dataplus._M_p >> 0x30);
  local_120._M_local_buf[7] = (char)((ulong)local_100._M_dataplus._M_p >> 0x38);
  *(undefined8 *)local_130._0_8_ = 0x6174756d5f746573;
  *(undefined8 *)(local_130._0_8_ + 8) = 0x5f7469625f656c62;
  *(undefined8 *)(local_130._0_8_ + 0xe) = 0x7265737261705f74;
  local_130._8_8_ = local_100._M_dataplus._M_p;
  *(FieldDescriptor *)(local_130._0_8_ + (long)local_100._M_dataplus._M_p) = (FieldDescriptor)0x0;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_130);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
  if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
    operator_delete((void *)local_130._0_8_);
  }
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
  }
  local_100._M_dataplus._M_p = (pointer)0x10;
  local_130._0_8_ = pFVar3;
  local_130._0_8_ = std::__cxx11::string::_M_create((ulong *)local_130,(ulong)&local_100);
  local_120._M_allocated_capacity._0_4_ = SUB84(local_100._M_dataplus._M_p,0);
  local_120._M_local_buf[4] = (char)((ulong)local_100._M_dataplus._M_p >> 0x20);
  local_120._M_local_buf[5] = (char)((ulong)local_100._M_dataplus._M_p >> 0x28);
  local_120._M_local_buf[6] = (char)((ulong)local_100._M_dataplus._M_p >> 0x30);
  local_120._M_local_buf[7] = (char)((ulong)local_100._M_dataplus._M_p >> 0x38);
  *(undefined8 *)local_130._0_8_ = 0x696c617469706163;
  *(undefined8 *)(local_130._0_8_ + 8) = 0x656d616e5f64657a;
  local_130._8_8_ = local_100._M_dataplus._M_p;
  *(FieldDescriptor *)(local_130._0_8_ + (long)local_100._M_dataplus._M_p) = (FieldDescriptor)0x0;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_130);
  pcVar7 = (pmVar14->_M_dataplus)._M_p;
  local_150._0_8_ = pFVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_150,pcVar7,pcVar7 + pmVar14->_M_string_length);
  std::__cxx11::string::append(local_150);
  local_100.field_2._M_allocated_capacity._0_5_ = 0x7561666564;
  local_100.field_2._M_local_buf[5] = 'l';
  local_100.field_2._M_allocated_capacity._6_2_ = 0x5f74;
  local_100.field_2._8_5_ = 0x7972746e65;
  local_100._M_string_length = 0xd;
  local_100.field_2._M_local_buf[0xd] = '\0';
  local_100._M_dataplus._M_p = (pointer)paVar4;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_100);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar4) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
  }
  if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
    operator_delete((void *)local_130._0_8_);
  }
  local_140._M_allocated_capacity._0_2_ = 0x6564;
  local_140._M_local_buf[2] = 'f';
  local_140._M_local_buf[3] = 'a';
  local_140._M_local_buf[4] = 'u';
  local_140._M_local_buf[5] = 'l';
  local_140._M_local_buf[6] = 't';
  local_140._M_local_buf[7] = '_';
  local_140._M_local_buf[8] = 'e';
  local_140._M_local_buf[9] = 'n';
  local_140._M_local_buf[10] = 't';
  local_140._M_local_buf[0xb] = 'r';
  local_140._M_local_buf[0xc] = 'y';
  local_150._8_8_ = 0xd;
  local_140._M_local_buf[0xd] = '\0';
  local_150._0_8_ = pFVar2;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](variables,(key_type *)local_150);
  local_100._M_dataplus._M_p = (pointer)0x13;
  local_130._0_8_ = pFVar3;
  local_130._0_8_ = std::__cxx11::string::_M_create((ulong *)local_130,(ulong)&local_100);
  local_120._M_allocated_capacity._0_4_ = SUB84(local_100._M_dataplus._M_p,0);
  local_120._M_local_buf[4] = (char)((ulong)local_100._M_dataplus._M_p >> 0x20);
  local_120._M_local_buf[5] = (char)((ulong)local_100._M_dataplus._M_p >> 0x28);
  local_120._M_local_buf[6] = (char)((ulong)local_100._M_dataplus._M_p >> 0x30);
  local_120._M_local_buf[7] = (char)((ulong)local_100._M_dataplus._M_p >> 0x38);
  *(undefined8 *)local_130._0_8_ = 0x6c6569665f70616d;
  *(undefined8 *)(local_130._0_8_ + 8) = 0x656d617261705f64;
  *(undefined4 *)(local_130._0_8_ + 0xf) = 0x72657465;
  local_130._8_8_ = local_100._M_dataplus._M_p;
  *(FieldDescriptor *)(local_130._0_8_ + (long)local_100._M_dataplus._M_p) = (FieldDescriptor)0x0;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_130);
  std::__cxx11::string::_M_assign((string *)pmVar14);
  if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
    operator_delete((void *)local_130._0_8_);
  }
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_78,(ClassNameResolver *)local_110,*(FileDescriptor **)(local_108 + 0x28),true);
  plVar18 = (long *)std::__cxx11::string::append((char *)&local_78);
  plVar20 = plVar18 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar18 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar20) {
    lVar8 = *plVar20;
    lVar10 = plVar18[3];
    local_100.field_2._M_allocated_capacity._0_5_ = (undefined5)lVar8;
    local_100.field_2._M_local_buf[5] = (char)((ulong)lVar8 >> 0x28);
    local_100.field_2._M_allocated_capacity._6_2_ = (undefined2)((ulong)lVar8 >> 0x30);
    local_100.field_2._8_5_ = (undefined5)lVar10;
    local_100.field_2._M_local_buf[0xd] = (char)((ulong)lVar10 >> 0x28);
    local_100.field_2._M_local_buf[0xe] = (char)((ulong)lVar10 >> 0x30);
    local_100.field_2._M_local_buf[0xf] = (char)((ulong)lVar10 >> 0x38);
    local_100._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    lVar8 = *plVar20;
    local_100.field_2._M_allocated_capacity._0_5_ = (undefined5)lVar8;
    local_100.field_2._M_local_buf[5] = (char)((ulong)lVar8 >> 0x28);
    local_100.field_2._M_allocated_capacity._6_2_ = (undefined2)((ulong)lVar8 >> 0x30);
    local_100._M_dataplus._M_p = (pointer)*plVar18;
  }
  local_100._M_string_length = plVar18[1];
  *plVar18 = (long)plVar20;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  pDVar13 = FieldDescriptor::message_type(local_108);
  UniqueFileScopeIdentifier_abi_cxx11_(&local_98,(java *)pDVar13,descriptor_00);
  uVar23 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar4) {
    uVar23 = CONCAT26(local_100.field_2._M_allocated_capacity._6_2_,
                      CONCAT15(local_100.field_2._M_local_buf[5],
                               local_100.field_2._M_allocated_capacity._0_5_));
  }
  if (uVar23 < local_98._M_string_length + local_100._M_string_length) {
    uVar23 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar23 = CONCAT17(local_98.field_2._M_local_buf[7],
                        local_98.field_2._M_allocated_capacity._0_7_);
    }
    if (local_98._M_string_length + local_100._M_string_length <= uVar23) {
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_98,0,(char *)0x0,(ulong)local_100._M_dataplus._M_p);
      goto LAB_002d4b09;
    }
  }
  puVar17 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_98._M_dataplus._M_p);
LAB_002d4b09:
  pFVar16 = (FieldDescriptor *)(puVar17 + 2);
  if ((FieldDescriptor *)*puVar17 == pFVar16) {
    uVar6 = *(undefined8 *)pFVar16;
    uVar9 = puVar17[3];
    local_120._M_allocated_capacity._0_4_ = (undefined4)uVar6;
    local_120._M_local_buf[4] = (char)((ulong)uVar6 >> 0x20);
    local_120._M_local_buf[5] = (char)((ulong)uVar6 >> 0x28);
    local_120._M_local_buf[6] = (char)((ulong)uVar6 >> 0x30);
    local_120._M_local_buf[7] = (char)((ulong)uVar6 >> 0x38);
    local_120._8_2_ = (undefined2)uVar9;
    local_120._M_local_buf[10] = (char)((ulong)uVar9 >> 0x10);
    local_120._11_2_ = (undefined2)((ulong)uVar9 >> 0x18);
    local_120._M_local_buf[0xd] = (char)((ulong)uVar9 >> 0x28);
    local_120._M_local_buf[0xe] = (char)((ulong)uVar9 >> 0x30);
    local_120._M_local_buf[0xf] = (char)((ulong)uVar9 >> 0x38);
    local_130._0_8_ = pFVar3;
  }
  else {
    uVar6 = *(undefined8 *)pFVar16;
    local_120._M_allocated_capacity._0_4_ = (undefined4)uVar6;
    local_120._M_local_buf[4] = (char)((ulong)uVar6 >> 0x20);
    local_120._M_local_buf[5] = (char)((ulong)uVar6 >> 0x28);
    local_120._M_local_buf[6] = (char)((ulong)uVar6 >> 0x30);
    local_120._M_local_buf[7] = (char)((ulong)uVar6 >> 0x38);
    local_130._0_8_ = (FieldDescriptor *)*puVar17;
  }
  local_130._8_8_ = puVar17[1];
  *puVar17 = pFVar16;
  puVar17[1] = 0;
  *pFVar16 = (FieldDescriptor)0x0;
  puVar17 = (undefined8 *)std::__cxx11::string::append(local_130);
  pFVar16 = (FieldDescriptor *)(puVar17 + 2);
  if ((FieldDescriptor *)*puVar17 == pFVar16) {
    uVar6 = *(undefined8 *)pFVar16;
    uVar9 = puVar17[3];
    local_140._M_allocated_capacity._0_2_ = (undefined2)uVar6;
    local_140._M_local_buf[2] = (char)((ulong)uVar6 >> 0x10);
    local_140._M_local_buf[3] = (char)((ulong)uVar6 >> 0x18);
    local_140._M_local_buf[4] = (char)((ulong)uVar6 >> 0x20);
    local_140._M_local_buf[5] = (char)((ulong)uVar6 >> 0x28);
    local_140._M_local_buf[6] = (char)((ulong)uVar6 >> 0x30);
    local_140._M_local_buf[7] = (char)((ulong)uVar6 >> 0x38);
    local_140._M_local_buf[8] = (char)uVar9;
    local_140._M_local_buf[9] = (char)((ulong)uVar9 >> 8);
    local_140._M_local_buf[10] = (char)((ulong)uVar9 >> 0x10);
    local_140._M_local_buf[0xb] = (char)((ulong)uVar9 >> 0x18);
    local_140._M_local_buf[0xc] = (char)((ulong)uVar9 >> 0x20);
    local_140._M_local_buf[0xd] = (char)((ulong)uVar9 >> 0x28);
    local_140._M_local_buf[0xe] = (char)((ulong)uVar9 >> 0x30);
    local_140._M_local_buf[0xf] = (char)((ulong)uVar9 >> 0x38);
    local_150._0_8_ = pFVar2;
  }
  else {
    uVar6 = *(undefined8 *)pFVar16;
    local_140._M_allocated_capacity._0_2_ = (undefined2)uVar6;
    local_140._M_local_buf[2] = (char)((ulong)uVar6 >> 0x10);
    local_140._M_local_buf[3] = (char)((ulong)uVar6 >> 0x18);
    local_140._M_local_buf[4] = (char)((ulong)uVar6 >> 0x20);
    local_140._M_local_buf[5] = (char)((ulong)uVar6 >> 0x28);
    local_140._M_local_buf[6] = (char)((ulong)uVar6 >> 0x30);
    local_140._M_local_buf[7] = (char)((ulong)uVar6 >> 0x38);
    local_150._0_8_ = (FieldDescriptor *)*puVar17;
  }
  local_150._8_8_ = puVar17[1];
  *puVar17 = pFVar16;
  puVar17[1] = 0;
  *(undefined1 *)(puVar17 + 2) = 0;
  local_50.field_2._M_allocated_capacity = 0x7470697263736564;
  local_50.field_2._8_2_ = 0x726f;
  local_50._M_string_length = 10;
  local_50.field_2._M_local_buf[10] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_50);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
  }
  if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
    operator_delete((void *)local_130._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar4) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_140._M_allocated_capacity._0_2_ = 0x3356;
  local_150._8_8_ = 2;
  local_140._M_local_buf[2] = '\0';
  local_120._M_allocated_capacity._0_4_ = 0x726576;
  local_130._8_8_ = 3;
  local_150._0_8_ = pFVar2;
  local_130._0_8_ = pFVar3;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_130);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_150);
  if ((FieldDescriptor *)local_130._0_8_ != pFVar3) {
    operator_delete((void *)local_130._0_8_);
  }
  if ((FieldDescriptor *)local_150._0_8_ != pFVar2) {
    operator_delete((void *)local_150._0_8_);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  return;
}

Assistant:

ImmutableMapFieldGenerator::ImmutableMapFieldGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    Context* context)
    : descriptor_(descriptor), name_resolver_(context->GetNameResolver()) {
  SetMessageVariables(descriptor, messageBitIndex, builderBitIndex,
                      context->GetFieldGeneratorInfo(descriptor), context,
                      &variables_);
}